

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testSetIntegerWithTags_Test::~Engine_testSetIntegerWithTags_Test
          (Engine_testSetIntegerWithTags_Test *this)

{
  void *in_RDI;
  
  ~Engine_testSetIntegerWithTags_Test((Engine_testSetIntegerWithTags_Test *)0x1303a8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testSetIntegerWithTags) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    e.Set("gauge.value", 100, Tag("An", "Integer"), Tag("Another", "Tag"));
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.gauge.value", im.name);
    ASSERT_EQ(MetricType::Gauge, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("An", im.tags[0].name);
    ASSERT_EQ("Integer", im.tags[0].value);
    ASSERT_EQ("Another", im.tags[1].name);
    ASSERT_EQ("Tag", im.tags[1].value);
}